

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O2

unique_ptr<MSX::Machine,_std::default_delete<MSX::Machine>_>
MSX::Machine::MSX(Target *target,ROMFetcher *rom_fetcher)

{
  int iVar1;
  function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
  *__args_1;
  _func_int **local_20;
  
  __args_1 = (function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
              *)__dynamic_cast(rom_fetcher,&Analyser::Static::Target::typeinfo,
                               &Analyser::Static::MSX::Target::typeinfo,0);
  iVar1 = *(int *)&__args_1[5].super__Function_base._M_manager;
  if (__args_1[4].super__Function_base._M_functor._M_pod_data[9] == '\x01') {
    if (iVar1 == 0) {
      std::
      make_unique<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,true>,Analyser::Static::MSX::Target_const&,std::function<std::map<ROM::Name,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<ROM::Name>,std::allocator<std::pair<ROM::Name_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>(ROM::Request_const&)>const&>
                ((Target *)&stack0xffffffffffffffe0,__args_1);
    }
    else {
      if (iVar1 != 1) {
LAB_00307c8d:
        target->_vptr_Target = (_func_int **)0x0;
        return (__uniq_ptr_data<MSX::Machine,_std::default_delete<MSX::Machine>,_true,_true>)
               (__uniq_ptr_data<MSX::Machine,_std::default_delete<MSX::Machine>,_true,_true>)target;
      }
      std::
      make_unique<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,true>,Analyser::Static::MSX::Target_const&,std::function<std::map<ROM::Name,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<ROM::Name>,std::allocator<std::pair<ROM::Name_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>(ROM::Request_const&)>const&>
                ((Target *)&stack0xffffffffffffffe0,__args_1);
    }
  }
  else if (iVar1 == 0) {
    std::
    make_unique<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,false>,Analyser::Static::MSX::Target_const&,std::function<std::map<ROM::Name,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<ROM::Name>,std::allocator<std::pair<ROM::Name_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>(ROM::Request_const&)>const&>
              ((Target *)&stack0xffffffffffffffe0,__args_1);
  }
  else {
    if (iVar1 != 1) goto LAB_00307c8d;
    std::
    make_unique<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,false>,Analyser::Static::MSX::Target_const&,std::function<std::map<ROM::Name,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<ROM::Name>,std::allocator<std::pair<ROM::Name_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>(ROM::Request_const&)>const&>
              ((Target *)&stack0xffffffffffffffe0,__args_1);
  }
  target->_vptr_Target = local_20;
  return (__uniq_ptr_data<MSX::Machine,_std::default_delete<MSX::Machine>,_true,_true>)
         (__uniq_ptr_data<MSX::Machine,_std::default_delete<MSX::Machine>,_true,_true>)target;
}

Assistant:

std::unique_ptr<Machine> Machine::MSX(const Analyser::Static::Target *target, const ROMMachine::ROMFetcher &rom_fetcher) {
	const auto msx_target = dynamic_cast<const Target *>(target);
	if(msx_target->has_msx_music) {
		switch(msx_target->model) {
			default: 					return nullptr;
			case Target::Model::MSX1:	return std::make_unique<ConcreteMachine<Target::Model::MSX1, true>>(*msx_target, rom_fetcher);
			case Target::Model::MSX2:	return std::make_unique<ConcreteMachine<Target::Model::MSX2, true>>(*msx_target, rom_fetcher);
		}
	} else {
		switch(msx_target->model) {
			default: 					return nullptr;
			case Target::Model::MSX1:	return std::make_unique<ConcreteMachine<Target::Model::MSX1, false>>(*msx_target, rom_fetcher);
			case Target::Model::MSX2:	return std::make_unique<ConcreteMachine<Target::Model::MSX2, false>>(*msx_target, rom_fetcher);
		}
	}
}